

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void writeLZ77data(LodePNGBitWriter *writer,uivector *lz77_encoded,HuffmanTree *tree_ll,
                  HuffmanTree *tree_d)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint value;
  uint distance_extra_bits;
  uint n_distance_extra_bits;
  uint distance_index;
  uint distance_code;
  uint length_extra_bits;
  uint n_length_extra_bits;
  uint length_index;
  uint val;
  size_t i;
  HuffmanTree *tree_d_local;
  HuffmanTree *tree_ll_local;
  uivector *lz77_encoded_local;
  LodePNGBitWriter *writer_local;
  
  for (_length_index = 0; _length_index != lz77_encoded->size; _length_index = _length_index + 1) {
    uVar1 = lz77_encoded->data[_length_index];
    writeBitsReversed(writer,tree_ll->codes[uVar1],(ulong)tree_ll->lengths[uVar1]);
    if (0x100 < uVar1) {
      uVar2 = lz77_encoded->data[_length_index + 2];
      uVar3 = DISTANCEEXTRA[uVar2];
      value = lz77_encoded->data[_length_index + 3];
      writeBits(writer,lz77_encoded->data[_length_index + 1],(ulong)LENGTHEXTRA[uVar1 - 0x101]);
      writeBitsReversed(writer,tree_d->codes[uVar2],(ulong)tree_d->lengths[uVar2]);
      writeBits(writer,value,(ulong)uVar3);
      _length_index = _length_index + 3;
    }
  }
  return;
}

Assistant:

static void writeLZ77data(LodePNGBitWriter* writer, const uivector* lz77_encoded,
                          const HuffmanTree* tree_ll, const HuffmanTree* tree_d) {
  size_t i = 0;
  for(i = 0; i != lz77_encoded->size; ++i) {
    unsigned val = lz77_encoded->data[i];
    writeBitsReversed(writer, tree_ll->codes[val], tree_ll->lengths[val]);
    if(val > 256) /*for a length code, 3 more things have to be added*/ {
      unsigned length_index = val - FIRST_LENGTH_CODE_INDEX;
      unsigned n_length_extra_bits = LENGTHEXTRA[length_index];
      unsigned length_extra_bits = lz77_encoded->data[++i];

      unsigned distance_code = lz77_encoded->data[++i];

      unsigned distance_index = distance_code;
      unsigned n_distance_extra_bits = DISTANCEEXTRA[distance_index];
      unsigned distance_extra_bits = lz77_encoded->data[++i];

      writeBits(writer, length_extra_bits, n_length_extra_bits);
      writeBitsReversed(writer, tree_d->codes[distance_code], tree_d->lengths[distance_code]);
      writeBits(writer, distance_extra_bits, n_distance_extra_bits);
    }
  }
}